

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::ReportCounts(BasicReporter *this,Totals *totals,string *allPrefix)

{
  size_t sVar1;
  ostream *poVar2;
  string *in_RDX;
  Counts *in_RSI;
  long in_RDI;
  Colour colour_1;
  Colour colour;
  undefined4 in_stack_fffffffffffffe78;
  Code in_stack_fffffffffffffe7c;
  pluralise *in_stack_fffffffffffffe80;
  allocator local_119;
  string local_118 [32];
  string *in_stack_ffffffffffffff08;
  Counts *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  BasicReporter *in_stack_ffffffffffffff20;
  allocator local_c9;
  string local_c8 [79];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  string *local_18;
  Counts *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = Counts::total(in_RSI);
  if (sVar1 == 0) {
    poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    std::operator<<(poVar2,"No tests ran");
  }
  else if (local_10->failed == 0) {
    Colour::Colour((Colour *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
    poVar2 = std::operator<<(poVar2,local_18);
    std::operator<<(poVar2,"tests passed (");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"assertion",&local_c9);
    pluralise::pluralise
              (in_stack_fffffffffffffe80,
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),(string *)0x1ea292);
    poVar2 = operator<<((ostream *)in_stack_fffffffffffffe80,
                        (pluralise *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::operator<<(poVar2," in ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"test case",&local_119);
    pluralise::pluralise
              (in_stack_fffffffffffffe80,
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),(string *)0x1ea314);
    poVar2 = operator<<((ostream *)in_stack_fffffffffffffe80,
                        (pluralise *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::operator<<(poVar2,")");
    pluralise::~pluralise((pluralise *)0x1ea34f);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    pluralise::~pluralise((pluralise *)0x1ea370);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    Colour::~Colour((Colour *)0x1ea397);
  }
  else {
    Colour::Colour((Colour *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"test case",&local_41);
    ReportCounts(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (local_10[1].failed != 0) {
      poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      std::operator<<(poVar2," (");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"assertion",&local_79);
      ReportCounts(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      std::operator<<(poVar2,")");
    }
    Colour::~Colour((Colour *)0x1ea1d5);
  }
  return;
}

Assistant:

void ReportCounts( const Totals& totals, const std::string& allPrefix = "All " ) {
            if( totals.assertions.total() == 0 ) {
                m_config.stream() << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                ReportCounts( "test case", totals.testCases, allPrefix );
                if( totals.testCases.failed > 0 ) {
                    m_config.stream() << " (";
                    ReportCounts( "assertion", totals.assertions, allPrefix );
                    m_config.stream() << ")";
                }
            }
            else {
                Colour colour( Colour::ResultSuccess );
                m_config.stream()   << allPrefix << "tests passed ("
                                    << pluralise( totals.assertions.passed, "assertion" ) << " in "
                                    << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }